

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMT_PUBLIC_PARMS_Unmarshal(TPMT_PUBLIC_PARMS *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPMI_ALG_PUBLIC_Unmarshal(&target->type,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMU_PUBLIC_PARMS_Unmarshal(&target->parameters,buffer,size,(uint)target->type);
  return TVar1;
}

Assistant:

TPM_RC
TPMT_PUBLIC_PARMS_Unmarshal(TPMT_PUBLIC_PARMS *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_ALG_PUBLIC_Unmarshal((TPMI_ALG_PUBLIC *)&(target->type), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_PUBLIC_PARMS_Unmarshal((TPMU_PUBLIC_PARMS *)&(target->parameters), buffer, size, (UINT32)target->type);
    return result;
}